

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,KeyComparator *cmp,
          Arena *arena)

{
  Node *pNVar1;
  long lVar2;
  char *local_10;
  
  (this->compare_).comparator.super_Comparator._vptr_Comparator =
       (_func_int **)&PTR__Comparator_00116b30;
  (this->compare_).comparator.user_comparator_ = (cmp->comparator).user_comparator_;
  this->arena_ = arena;
  local_10 = (char *)0x0;
  pNVar1 = NewNode(this,&local_10,0xc);
  this->head_ = pNVar1;
  this->max_height_ = (__atomic_base<int>)0x1;
  this->rnd_ = 0x5eadbeef;
  for (lVar2 = 1; lVar2 != 0xd; lVar2 = lVar2 + 1) {
    this->head_->next_[lVar2 + -1]._M_b._M_p = (__pointer_type)0x0;
  }
  return;
}

Assistant:

SkipList<Key, Comparator>::SkipList(Comparator cmp, Arena* arena)
    : compare_(cmp),
      arena_(arena),
      head_(NewNode(0 /* any key will do */, kMaxHeight)),
      max_height_(1),
      rnd_(0xdeadbeef) {
  for (int i = 0; i < kMaxHeight; i++) {
    head_->SetNext(i, nullptr);
  }
}